

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddEssent.c
# Opt level: O2

int Cudd_PrintTwoLiteralClauses(DdManager *dd,DdNode *f,char **names,FILE *fp)

{
  ulong uVar1;
  uint uVar2;
  DdHalfWord *pDVar3;
  long *plVar4;
  uint uVar5;
  int iVar6;
  DdTlcInfo *t;
  ulong uVar7;
  char *pcVar8;
  char *pcVar9;
  ulong uVar10;
  
  t = Cudd_FindTwoLiteralClauses(dd,f);
  if (fp == (FILE *)0x0) {
    fp = dd->out;
  }
  if (t == (DdTlcInfo *)0x0) {
    iVar6 = 0;
  }
  else {
    pDVar3 = t->vars;
    plVar4 = t->phases;
    uVar10 = 1;
    while( true ) {
      uVar5 = pDVar3[uVar10 - 1];
      uVar7 = (ulong)uVar5;
      uVar2 = pDVar3[uVar10];
      if (uVar2 == 0 && uVar5 == 0) break;
      uVar1 = uVar10 - 1;
      uVar5 = (uint)uVar1;
      if (names == (char **)0x0) {
        if (uVar2 == 0x7fffffff) {
          if ((plVar4 == (long *)0x0) ||
             (pcVar8 = " & ~", ((ulong)plVar4[uVar1 >> 6 & 0x3ffffff] >> (uVar5 & 0x3e) & 1) == 0))
          {
            pcVar8 = "\r\n\t ";
          }
          fprintf((FILE *)fp,"%s%d\n",pcVar8 + 3);
        }
        else {
          pcVar8 = " ";
          pcVar9 = " ";
          if (plVar4 != (long *)0x0) {
            pcVar9 = "~";
            pcVar8 = " & ~";
            if (((ulong)plVar4[uVar1 >> 6 & 0x3ffffff] >> (uVar5 & 0x3e) & 1) == 0) {
              pcVar8 = "\r\n\t ";
            }
            pcVar8 = pcVar8 + 3;
            if (((ulong)plVar4[uVar1 >> 6 & 0x3ffffff] >> (uVar10 & 0x3f) & 1) == 0) {
              pcVar9 = " ";
            }
          }
          fprintf((FILE *)fp,"%s%d | %s%d\n",pcVar8,uVar7,pcVar9);
        }
      }
      else if (uVar2 == 0x7fffffff) {
        if ((plVar4 == (long *)0x0) ||
           (pcVar8 = " & ~", ((ulong)plVar4[uVar1 >> 6 & 0x3ffffff] >> (uVar5 & 0x3e) & 1) == 0)) {
          pcVar8 = "\r\n\t ";
        }
        fprintf((FILE *)fp,"%s%s\n",pcVar8 + 3,names[uVar7]);
      }
      else {
        pcVar8 = " ";
        pcVar9 = " ";
        if (plVar4 != (long *)0x0) {
          pcVar9 = "~";
          pcVar8 = " & ~";
          if (((ulong)plVar4[uVar1 >> 6 & 0x3ffffff] >> (uVar5 & 0x3e) & 1) == 0) {
            pcVar8 = "\r\n\t ";
          }
          pcVar8 = pcVar8 + 3;
          if (((ulong)plVar4[uVar1 >> 6 & 0x3ffffff] >> (uVar10 & 0x3f) & 1) == 0) {
            pcVar9 = " ";
          }
        }
        fprintf((FILE *)fp,"%s%s | %s%s\n",pcVar8,names[uVar7],pcVar9,names[uVar2]);
      }
      uVar10 = uVar10 + 2;
    }
    Cudd_tlcInfoFree(t);
    iVar6 = 1;
  }
  return iVar6;
}

Assistant:

int
Cudd_PrintTwoLiteralClauses(
  DdManager * dd,
  DdNode * f,
  char **names,
  FILE *fp)
{
    DdHalfWord *vars;
    BitVector *phases;
    int i;
    DdTlcInfo *res = Cudd_FindTwoLiteralClauses(dd, f);
    FILE *ifp = fp == NULL ? dd->out : fp;

    if (res == NULL) return(0);
    vars = res->vars;
    phases = res->phases;
    for (i = 0; !sentinelp(vars[i], vars[i+1]); i += 2) {
        if (names != NULL) {
            if (vars[i+1] == CUDD_MAXINDEX) {
                (void) fprintf(ifp, "%s%s\n",
                               bitVectorRead(phases, i) ? "~" : " ",
                               names[vars[i]]);
            } else {
                (void) fprintf(ifp, "%s%s | %s%s\n",
                               bitVectorRead(phases, i) ? "~" : " ",
                               names[vars[i]],
                               bitVectorRead(phases, i+1) ? "~" : " ",
                               names[vars[i+1]]);
            }
        } else {
            if (vars[i+1] == CUDD_MAXINDEX) {
                (void) fprintf(ifp, "%s%d\n",
                               bitVectorRead(phases, i) ? "~" : " ",
                               (int) vars[i]);
            } else {
                (void) fprintf(ifp, "%s%d | %s%d\n",
                               bitVectorRead(phases, i) ? "~" : " ",
                               (int) vars[i],
                               bitVectorRead(phases, i+1) ? "~" : " ",
                               (int) vars[i+1]);
            }
        }
    }
    Cudd_tlcInfoFree(res);

    return(1);

}